

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O2

void Eigen::internal::
     call_triangular_assignment_loop<10,false,Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>,10u>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
               (TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               *src,assign_op<double,_double> *func)

{
  long cols;
  MatrixTypeNested pMVar1;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType local_50;
  DstEvaluatorType local_40;
  triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_30;
  
  local_50.m_functor.m_other = (src->m_functor).m_other;
  local_40.
  super_unary_evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>,_Eigen::internal::IndexBased,_double>
  .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
  m_outerStride = (src->m_rows).m_value;
  cols = (src->m_cols).m_value;
  pMVar1 = dst->m_matrix;
  if (((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
       != local_40.
          super_unary_evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>,_Eigen::internal::IndexBased,_double>
          .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
          m_outerStride) ||
     ((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      cols)) {
    TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>::resize
              ((TriangularBase<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>
                *)dst,local_40.
                      super_unary_evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>,_Eigen::internal::IndexBased,_double>
                      .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      .m_d.m_outerStride,cols);
    pMVar1 = dst->m_matrix;
    local_40.
    super_unary_evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>,_Eigen::internal::IndexBased,_double>
    .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.
    m_outerStride =
         (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
  }
  local_40.
  super_unary_evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>,_Eigen::internal::IndexBased,_double>
  .super_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_d.data =
       (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  local_30.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  .m_dst = &local_40;
  local_30.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  .m_src = &local_50;
  local_30.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  .m_functor = func;
  local_30.
  super_generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  .m_dstExpr = dst;
  triangular_assignment_loop<Eigen::internal::triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_10U,_-1,_false>
  ::run(&local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_triangular_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
    dst.resize(dstRows, dstCols);
  DstEvaluatorType dstEvaluator(dst);

  typedef triangular_dense_assignment_kernel< Mode&(Lower|Upper),Mode&(UnitDiag|ZeroDiag|SelfAdjoint),SetOpposite,
                                              DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  enum {
      unroll = DstXprType::SizeAtCompileTime != Dynamic
            && SrcEvaluatorType::CoeffReadCost < HugeCost
            && DstXprType::SizeAtCompileTime * (int(DstEvaluatorType::CoeffReadCost) + int(SrcEvaluatorType::CoeffReadCost)) / 2 <= EIGEN_UNROLLING_LIMIT
    };

  triangular_assignment_loop<Kernel, Mode, unroll ? int(DstXprType::SizeAtCompileTime) : Dynamic, SetOpposite>::run(kernel);
}